

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oslib-posix.c
# Opt level: O2

void qemu_anon_ram_free(uc_struct *uc,void *ptr,size_t size)

{
  if (ptr != (void *)0x0) {
    munmap(ptr,size + uc->qemu_real_host_page_size);
    return;
  }
  return;
}

Assistant:

static void qemu_ram_munmap(struct uc_struct *uc, void *ptr, size_t size)
{
    size_t pagesize;

    if (ptr) {
        /* Unmap both the RAM block and the guard page */
#if defined(__powerpc64__) && defined(__linux__)
        pagesize = qemu_fd_getpagesize(uc);
#else
        pagesize = uc->qemu_real_host_page_size;
#endif
        munmap(ptr, size + pagesize);
    }
}